

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int scalar_to_cbb(CBB *out,EC_GROUP *group,EC_SCALAR *scalar)

{
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  ulong local_38;
  size_t scalar_len;
  uint8_t *buf;
  EC_SCALAR *scalar_local;
  EC_GROUP *group_local;
  CBB *out_local;
  
  buf = (uint8_t *)scalar;
  scalar_local = (EC_SCALAR *)group;
  group_local = (EC_GROUP *)out;
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  local_38 = (ulong)uVar1;
  iVar2 = CBB_add_space((CBB *)group_local,(uint8_t **)&scalar_len,local_38);
  if (iVar2 != 0) {
    ec_scalar_to_bytes((EC_GROUP *)scalar_local,(uint8_t *)scalar_len,&local_38,(EC_SCALAR *)buf);
  }
  out_local._4_4_ = (uint)(iVar2 != 0);
  return out_local._4_4_;
}

Assistant:

static int scalar_to_cbb(CBB *out, const EC_GROUP *group,
                         const EC_SCALAR *scalar) {
  uint8_t *buf;
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  if (!CBB_add_space(out, &buf, scalar_len)) {
    return 0;
  }
  ec_scalar_to_bytes(group, buf, &scalar_len, scalar);
  return 1;
}